

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

LaneArray<8> * __thiscall
wasm::getLanes<short,8>(LaneArray<8> *__return_storage_ptr__,wasm *this,Literal *val)

{
  bool bVar1;
  byte *pbVar2;
  reference this_00;
  Literal local_80;
  ulong local_58;
  size_t offset;
  ulong uStack_48;
  short lane;
  size_t lane_index;
  undefined1 local_38 [8];
  array<unsigned_char,_16UL> bytes;
  size_t lane_width;
  Literal *local_18;
  Literal *val_local;
  LaneArray<8> *lanes;
  
  lane_width._4_4_ = 6;
  local_18 = (Literal *)this;
  val_local = __return_storage_ptr__->_M_elems;
  bVar1 = Type::operator==((Type *)(this + 0x10),(BasicType *)((long)&lane_width + 4));
  if (bVar1) {
    bytes._M_elems[8] = '\x02';
    bytes._M_elems[9] = '\0';
    bytes._M_elems[10] = '\0';
    bytes._M_elems[0xb] = '\0';
    bytes._M_elems[0xc] = '\0';
    bytes._M_elems[0xd] = '\0';
    bytes._M_elems[0xe] = '\0';
    bytes._M_elems[0xf] = '\0';
    _local_38 = Literal::getv128(local_18);
    lane_index._7_1_ = 0;
    std::array<wasm::Literal,_8UL>::array(__return_storage_ptr__);
    for (uStack_48 = 0; uStack_48 < 8; uStack_48 = uStack_48 + 1) {
      offset._6_2_ = 0;
      for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
        pbVar2 = std::array<unsigned_char,_16UL>::at
                           ((array<unsigned_char,_16UL> *)local_38,local_58 + uStack_48 * 2);
        offset._6_2_ = offset._6_2_ |
                       (ushort)((int)(short)(ushort)*pbVar2 << ((byte)(local_58 << 3) & 0x1f));
      }
      Literal::Literal(&local_80,(int)(short)offset._6_2_);
      this_00 = std::array<wasm::Literal,_8UL>::at(__return_storage_ptr__,uStack_48);
      Literal::operator=(this_00,&local_80);
      Literal::~Literal(&local_80);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Type::v128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x647,"LaneArray<Lanes> wasm::getLanes(const Literal &) [LaneT = short, Lanes = 8]"
               );
}

Assistant:

static LaneArray<Lanes> getLanes(const Literal& val) {
  assert(val.type == Type::v128);
  const size_t lane_width = 16 / Lanes;
  std::array<uint8_t, 16> bytes = val.getv128();
  LaneArray<Lanes> lanes;
  for (size_t lane_index = 0; lane_index < Lanes; ++lane_index) {
    LaneT lane(0);
    for (size_t offset = 0; offset < lane_width; ++offset) {
      lane |= LaneT(bytes.at(lane_index * lane_width + offset))
              << LaneT(8 * offset);
    }
    lanes.at(lane_index) = Literal(lane);
  }
  return lanes;
}